

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

int float_comp_to_cc(CPUS390XState_conflict *env,int float_compare)

{
  CPUState *cpu;
  int float_compare_local;
  CPUS390XState_conflict *env_local;
  
  switch(float_compare) {
  case 0:
    env_local._4_4_ = 0;
    break;
  case 1:
    env_local._4_4_ = 2;
    break;
  case 2:
    env_local._4_4_ = 3;
    break;
  case -1:
    env_local._4_4_ = 1;
    break;
  default:
    cpu = env_cpu(env);
    cpu_abort_s390x(cpu,"unknown return value for float compare\n");
  }
  return env_local._4_4_;
}

Assistant:

int float_comp_to_cc(CPUS390XState *env, int float_compare)
{
    switch (float_compare) {
    case float_relation_equal:
        return 0;
    case float_relation_less:
        return 1;
    case float_relation_greater:
        return 2;
    case float_relation_unordered:
        return 3;
    default:
        cpu_abort(env_cpu(env), "unknown return value for float compare\n");
    }
}